

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_node **ppcVar1;
  cgltf_component_type cVar2;
  uint uVar3;
  int iVar4;
  cgltf_accessor *pcVar5;
  long lVar6;
  cgltf_buffer_view *pcVar7;
  ulong *puVar8;
  ulong uVar9;
  cgltf_mesh *pcVar10;
  cgltf_primitive *pcVar11;
  cgltf_accessor *pcVar12;
  cgltf_animation_channel *pcVar13;
  long *plVar14;
  cgltf_size cVar15;
  cgltf_size cVar16;
  cgltf_size i_1;
  cgltf_node *pcVar17;
  cgltf_size j;
  cgltf_size cVar18;
  cgltf_accessor **ppcVar19;
  cgltf_node *pcVar20;
  cgltf_node *pcVar21;
  cgltf_size cVar22;
  ulong uVar23;
  cgltf_size cVar24;
  long lVar25;
  cgltf_size cVar26;
  cgltf_size i;
  long lVar27;
  bool bVar28;
  
  cVar26 = data->accessors_count;
  lVar27 = 0xe8;
  while (bVar28 = cVar26 != 0, cVar26 = cVar26 - 1, bVar28) {
    pcVar5 = data->accessors;
    cVar15 = cgltf_calc_size(*(cgltf_type *)((long)pcVar5 + lVar27 + -0xe0),
                             *(cgltf_component_type *)((long)pcVar5 + lVar27 + -0xe8));
    lVar6 = *(long *)((long)pcVar5 + lVar27 + -0xc0);
    if ((lVar6 != 0) &&
       (*(ulong *)(lVar6 + 0x10) <
        *(long *)((long)pcVar5 + lVar27 + -0xd8) + cVar15 +
        (*(long *)((long)pcVar5 + lVar27 + -0xd0) + -1) * *(long *)((long)pcVar5 + lVar27 + -200)))
    {
      return cgltf_result_data_too_short;
    }
    if (*(int *)((long)pcVar5->min + lVar27 + -100) != 0) {
      cVar2 = *(cgltf_component_type *)((long)pcVar5->min + lVar27 + -0x44);
      cVar16 = cgltf_calc_size(cgltf_type_scalar,cVar2);
      cVar22 = *(cgltf_size *)((long)pcVar5->min + lVar27 + -0x4c);
      cVar18 = *(cgltf_size *)((long)pcVar5->min + lVar27 + -0x5c);
      pcVar7 = *(cgltf_buffer_view **)((long)pcVar5->min + lVar27 + -0x54);
      if (pcVar7->size < cVar16 * cVar18 + cVar22) {
        return cgltf_result_data_too_short;
      }
      if (*(ulong *)(*(long *)((long)pcVar5->min + lVar27 + -0x3c) + 0x10) <
          cVar15 * cVar18 + *(long *)((long)pcVar5->min + lVar27 + -0x34)) {
        return cgltf_result_data_too_short;
      }
      if (cgltf_component_type_r_32u < cVar2) {
        return cgltf_result_invalid_gltf;
      }
      if ((0x34U >> (cVar2 & 0x1f) & 1) == 0) {
        return cgltf_result_invalid_gltf;
      }
      if ((pcVar7->buffer->data != (void *)0x0) &&
         (cVar15 = cgltf_calc_index_bound(pcVar7,cVar22,cVar2,cVar18),
         *(ulong *)((long)pcVar5 + lVar27 + -0xd0) <= cVar15)) {
        return cgltf_result_data_too_short;
      }
    }
    lVar27 = lVar27 + 0x170;
  }
  cVar26 = data->buffer_views_count;
  lVar27 = 100;
  do {
    bVar28 = cVar26 == 0;
    cVar26 = cVar26 - 1;
    if (bVar28) {
      cVar26 = data->meshes_count;
      for (cVar15 = 0; cVar15 != cVar26; cVar15 = cVar15 + 1) {
        pcVar10 = data->meshes;
        if (((pcVar10[cVar15].weights != (cgltf_float *)0x0) &&
            (pcVar10[cVar15].primitives_count != 0)) &&
           ((pcVar10[cVar15].primitives)->targets_count != pcVar10[cVar15].weights_count)) {
          return cgltf_result_invalid_gltf;
        }
        cVar22 = pcVar10[cVar15].primitives_count;
        if (pcVar10[cVar15].target_names != (char **)0x0) {
          if (cVar22 == 0) {
            cVar22 = 0;
          }
          else if ((pcVar10[cVar15].primitives)->targets_count != pcVar10[cVar15].target_names_count
                  ) {
            return cgltf_result_invalid_gltf;
          }
        }
        for (cVar18 = 0; cVar18 != cVar22; cVar18 = cVar18 + 1) {
          pcVar11 = pcVar10[cVar15].primitives;
          cVar16 = pcVar11[cVar18].attributes_count;
          if (cVar16 != 0) {
            pcVar5 = (pcVar11[cVar18].attributes)->data;
            if (pcVar5 != (cgltf_accessor *)0x0) {
              ppcVar19 = &(pcVar11[cVar18].attributes)->data;
              while (bVar28 = cVar16 != 0, cVar16 = cVar16 - 1, bVar28) {
                if ((*ppcVar19 != (cgltf_accessor *)0x0) && ((*ppcVar19)->count != pcVar5->count)) {
                  return cgltf_result_invalid_gltf;
                }
                ppcVar19 = ppcVar19 + 4;
              }
              for (cVar16 = 0; cVar16 != pcVar11[cVar18].targets_count; cVar16 = cVar16 + 1) {
                cVar24 = pcVar11[cVar18].targets[cVar16].attributes_count;
                lVar27 = 0x10;
                while (bVar28 = cVar24 != 0, cVar24 = cVar24 - 1, bVar28) {
                  lVar6 = *(long *)((long)&(pcVar11[cVar18].targets[cVar16].attributes)->name +
                                   lVar27);
                  if ((lVar6 != 0) && (*(cgltf_size *)(lVar6 + 0x18) != pcVar5->count)) {
                    return cgltf_result_invalid_gltf;
                  }
                  lVar27 = lVar27 + 0x20;
                }
              }
              pcVar12 = pcVar11[cVar18].indices;
              if (pcVar12 != (cgltf_accessor *)0x0) {
                cVar2 = pcVar12->component_type;
                if (cgltf_component_type_r_32u < cVar2) {
                  return cgltf_result_invalid_gltf;
                }
                if ((0x34U >> (cVar2 & 0x1f) & 1) == 0) {
                  return cgltf_result_invalid_gltf;
                }
                pcVar7 = pcVar12->buffer_view;
                if (((pcVar7 != (cgltf_buffer_view *)0x0) && (pcVar7->buffer->data != (void *)0x0))
                   && (cVar16 = cgltf_calc_index_bound(pcVar7,pcVar12->offset,cVar2,pcVar12->count),
                      pcVar5->count <= cVar16)) {
                  return cgltf_result_data_too_short;
                }
              }
            }
          }
        }
      }
      lVar27 = 0x48;
      cVar26 = data->nodes_count;
      while (bVar28 = cVar26 != 0, cVar26 = cVar26 - 1, bVar28) {
        pcVar17 = data->nodes;
        if (((*(long *)((long)pcVar17->translation + lVar27 + -0x68) != 0) &&
            (lVar6 = *(long *)((long)pcVar17->translation + lVar27 + -0x80), lVar6 != 0)) &&
           ((*(long *)(lVar6 + 0x10) != 0 &&
            (*(long *)(*(long *)(lVar6 + 8) + 0x30) !=
             *(long *)((long)pcVar17->translation + lVar27 + -0x60))))) {
          return cgltf_result_invalid_gltf;
        }
        lVar27 = lVar27 + 0xf0;
      }
      cVar26 = 0;
LAB_00105e16:
      if (cVar26 == data->nodes_count) {
        for (cVar26 = 0; cVar26 != data->scenes_count; cVar26 = cVar26 + 1) {
          cVar15 = 0;
          while (data->scenes[cVar26].nodes_count != cVar15) {
            ppcVar1 = data->scenes[cVar26].nodes + cVar15;
            cVar15 = cVar15 + 1;
            if ((*ppcVar1)->parent != (cgltf_node *)0x0) {
              return cgltf_result_invalid_gltf;
            }
          }
        }
        cVar26 = 0;
        do {
          if (cVar26 == data->animations_count) {
            return cgltf_result_success;
          }
          cVar15 = data->animations[cVar26].channels_count;
          lVar27 = 0x10;
          while (bVar28 = cVar15 != 0, cVar15 = cVar15 - 1, bVar28) {
            pcVar13 = data->animations[cVar26].channels;
            lVar6 = *(long *)((long)pcVar13 + lVar27 + -8);
            if (lVar6 != 0) {
              lVar25 = 1;
              if (*(int *)((long)&pcVar13->sampler + lVar27) == 4) {
                lVar6 = *(long *)(lVar6 + 0x28);
                if (lVar6 == 0) {
                  return cgltf_result_invalid_gltf;
                }
                if (*(long *)(lVar6 + 0x10) == 0) {
                  return cgltf_result_invalid_gltf;
                }
                lVar25 = *(long *)(*(long *)(lVar6 + 8) + 0x30);
              }
              plVar14 = *(long **)((long)pcVar13 + lVar27 + -0x10);
              if (lVar25 * *(long *)(*plVar14 + 0x18) * ((ulong)((int)plVar14[2] == 2) * 2 + 1) -
                  *(long *)(plVar14[1] + 0x18) != 0) {
                return cgltf_result_data_too_short;
              }
            }
            lVar27 = lVar27 + 0x38;
          }
          cVar26 = cVar26 + 1;
        } while( true );
      }
      pcVar17 = data->nodes[cVar26].parent;
      pcVar21 = pcVar17;
      if (pcVar17 == (cgltf_node *)0x0) {
        pcVar20 = (cgltf_node *)0x0;
        goto LAB_00105e3d;
      }
      do {
        pcVar20 = pcVar21->parent;
LAB_00105e3d:
        do {
          if ((pcVar17 == (cgltf_node *)0x0) || (pcVar20 == (cgltf_node *)0x0)) {
            cVar26 = cVar26 + 1;
            goto LAB_00105e16;
          }
          if (pcVar17 == pcVar20) {
            return cgltf_result_invalid_gltf;
          }
          pcVar17 = pcVar17->parent;
          ppcVar1 = &pcVar20->parent;
          pcVar20 = (cgltf_node *)0x0;
          pcVar21 = *ppcVar1;
        } while (*ppcVar1 == (cgltf_node *)0x0);
      } while( true );
    }
    pcVar7 = data->buffer_views;
    puVar8 = *(ulong **)((long)pcVar7 + lVar27 + -100);
    if ((puVar8 != (ulong *)0x0) &&
       (*puVar8 < (ulong)(*(long *)((long)pcVar7 + lVar27 + -0x54) +
                         *(long *)((long)pcVar7 + lVar27 + -0x5c)))) {
      return cgltf_result_data_too_short;
    }
    if (*(int *)((long)pcVar7 + lVar27 + -0x34) != 0) {
      puVar8 = *(ulong **)((long)pcVar7 + lVar27 + -0x2c);
      if (puVar8 == (ulong *)0x0) {
        return cgltf_result_data_too_short;
      }
      if (*puVar8 < (ulong)(*(long *)((long)pcVar7 + lVar27 + -0x1c) +
                           *(long *)((long)pcVar7 + lVar27 + -0x24))) {
        return cgltf_result_data_too_short;
      }
      uVar9 = *(ulong *)((long)pcVar7 + lVar27 + -0x4c);
      uVar23 = *(ulong *)((long)pcVar7 + lVar27 + -0x14);
      if ((uVar9 != 0) && (bVar28 = uVar23 != uVar9, uVar23 = uVar9, bVar28)) {
        return cgltf_result_invalid_gltf;
      }
      uVar9 = *(ulong *)((long)pcVar7 + lVar27 + -0xc);
      if (*(long *)((long)pcVar7 + lVar27 + -0x54) != uVar9 * uVar23) {
        return cgltf_result_invalid_gltf;
      }
      uVar3 = *(uint *)((long)pcVar7 + lVar27 + -4);
      if (uVar3 == 1) {
        if (0x100 < uVar23) {
          return cgltf_result_invalid_gltf;
        }
        if ((uVar23 & 3) != 0) {
          return cgltf_result_invalid_gltf;
        }
      }
      else {
        if (uVar3 == 2) {
          if (uVar9 % 3 != 0) {
            return cgltf_result_invalid_gltf;
          }
        }
        else {
          if (uVar3 == 0) {
            return cgltf_result_invalid_gltf;
          }
          if ((uVar3 & 0xfffffffe) != 2) goto LAB_00105c14;
        }
        if ((uVar23 != 4) && (uVar23 != 2)) {
          return cgltf_result_invalid_gltf;
        }
        if (*(int *)((long)&pcVar7->buffer + lVar27) != 0) {
          return cgltf_result_invalid_gltf;
        }
      }
LAB_00105c14:
      iVar4 = *(int *)((long)&pcVar7->buffer + lVar27);
      if (((iVar4 == 2) || ((iVar4 == 1 && (uVar23 != 4)))) && (uVar23 != 8)) {
        return cgltf_result_invalid_gltf;
      }
    }
    lVar27 = lVar27 + 0x90;
  } while( true );
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
	for (cgltf_size i = 0; i < data->accessors_count; ++i)
	{
		cgltf_accessor* accessor = &data->accessors[i];

		cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

		if (accessor->buffer_view)
		{
			cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

			if (accessor->buffer_view->size < req_size)
			{
				return cgltf_result_data_too_short;
			}
		}

		if (accessor->is_sparse)
		{
			cgltf_accessor_sparse* sparse = &accessor->sparse;

			cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
			cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
			cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

			if (sparse->indices_buffer_view->size < indices_req_size ||
				sparse->values_buffer_view->size < values_req_size)
			{
				return cgltf_result_data_too_short;
			}

			if (sparse->indices_component_type != cgltf_component_type_r_8u &&
				sparse->indices_component_type != cgltf_component_type_r_16u &&
				sparse->indices_component_type != cgltf_component_type_r_32u)
			{
				return cgltf_result_invalid_gltf;
			}

			if (sparse->indices_buffer_view->buffer->data)
			{
				cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

				if (index_bound >= accessor->count)
				{
					return cgltf_result_data_too_short;
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
	{
		cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

		if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
		{
			return cgltf_result_data_too_short;
		}

		if (data->buffer_views[i].has_meshopt_compression)
		{
			cgltf_meshopt_compression* mc = &data->buffer_views[i].meshopt_compression;

			if (mc->buffer == NULL || mc->buffer->size < mc->offset + mc->size)
			{
				return cgltf_result_data_too_short;
			}

			if (data->buffer_views[i].stride && mc->stride != data->buffer_views[i].stride)
			{
				return cgltf_result_invalid_gltf;
			}

			if (data->buffer_views[i].size != mc->stride * mc->count)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_invalid)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_attributes && !(mc->stride % 4 == 0 && mc->stride <= 256))
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->mode == cgltf_meshopt_compression_mode_triangles && mc->count % 3 != 0)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->stride != 2 && mc->stride != 4)
			{
				return cgltf_result_invalid_gltf;
			}

			if ((mc->mode == cgltf_meshopt_compression_mode_triangles || mc->mode == cgltf_meshopt_compression_mode_indices) && mc->filter != cgltf_meshopt_compression_filter_none)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_octahedral && mc->stride != 4 && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}

			if (mc->filter == cgltf_meshopt_compression_filter_quaternion && mc->stride != 8)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->meshes_count; ++i)
	{
		if (data->meshes[i].weights)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		if (data->meshes[i].target_names)
		{
			if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}

		for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
		{
			//
			// Skip target count check because some VRM files omit targets for root primitive
			// which is not valid for glTF but has been accepted for VRM 
			//
			//if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
			//{
			//	return cgltf_result_invalid_gltf;
			//}

			if (data->meshes[i].primitives[j].attributes_count)
			{
				cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;
				if (first == NULL) continue;

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
				{
					cgltf_accessor* accessor = data->meshes[i].primitives[j].attributes[k].data;
					if (accessor && accessor->count != first->count)
					{
						return cgltf_result_invalid_gltf;
					}
				}

				for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
				{
					for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
					{
						cgltf_accessor* accessor = data->meshes[i].primitives[j].targets[k].attributes[m].data;
						if (accessor && accessor->count != first->count)
						{
							return cgltf_result_invalid_gltf;
						}
					}
				}

				cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

				if (indices &&
					indices->component_type != cgltf_component_type_r_8u &&
					indices->component_type != cgltf_component_type_r_16u &&
					indices->component_type != cgltf_component_type_r_32u)
				{
					return cgltf_result_invalid_gltf;
				}

				if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
				{
					cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

					if (index_bound >= first->count)
					{
						return cgltf_result_data_too_short;
					}
				}
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		if (data->nodes[i].weights && data->nodes[i].mesh)
		{
			if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->nodes_count; ++i)
	{
		cgltf_node* p1 = data->nodes[i].parent;
		cgltf_node* p2 = p1 ? p1->parent : NULL;

		while (p1 && p2)
		{
			if (p1 == p2)
			{
				return cgltf_result_invalid_gltf;
			}

			p1 = p1->parent;
			p2 = p2->parent ? p2->parent->parent : NULL;
		}
	}

	for (cgltf_size i = 0; i < data->scenes_count; ++i)
	{
		for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
		{
			if (data->scenes[i].nodes[j]->parent)
			{
				return cgltf_result_invalid_gltf;
			}
		}
	}

	for (cgltf_size i = 0; i < data->animations_count; ++i)
	{
		for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
		{
			cgltf_animation_channel* channel = &data->animations[i].channels[j];

			if (!channel->target_node)
			{
				continue;
			}

			cgltf_size components = 1;

			if (channel->target_path == cgltf_animation_path_type_weights)
			{
				if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
				{
					return cgltf_result_invalid_gltf;
				}

				components = channel->target_node->mesh->primitives[0].targets_count;
			}

			cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

			if (channel->sampler->input->count * components * values != channel->sampler->output->count)
			{
				return cgltf_result_data_too_short;
			}
		}
	}

	return cgltf_result_success;
}